

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ds_list.c
# Opt level: O2

DS_STATUS ds_list_insert(DsList *list,int index,void *data)

{
  ulong uVar1;
  DS_STATUS DVar2;
  DsListEntry *in;
  DsListEntry *pDVar3;
  DsList *entryAdd;
  ulong uVar4;
  
  DVar2 = DS_STATUS_NULL;
  if (list != (DsList *)0x0) {
    DVar2 = DS_STATUS_OUTMEM;
    if (-1 < index) {
      uVar4 = (ulong)(uint)index;
      uVar1 = list->size;
      if (uVar4 <= uVar1) {
        in = (DsListEntry *)malloc(0x18);
        if (in != (DsListEntry *)0x0) {
          in->data = data;
          in->next = (DsListEntry *)0x0;
          in->prev = (DsListEntry *)0x0;
          pDVar3 = list->entry;
          entryAdd = list;
          for (; ((pDVar3 != (DsListEntry *)0x0 && (pDVar3->next != (DsListEntry *)0x0)) &&
                 (0 < (int)uVar4)); uVar4 = uVar4 - 1) {
            entryAdd = (DsList *)&pDVar3->next;
            pDVar3 = pDVar3->next;
          }
          if (uVar1 == uVar4) {
            DVar2 = ds_entry_append(&entryAdd->entry,in);
          }
          else {
            DVar2 = ds_entry_prepend(&entryAdd->entry,in);
          }
          if (DVar2 == DS_STATUS_OK) {
            list->size = list->size + 1;
            DVar2 = DS_STATUS_OK;
          }
          else {
            free(in);
            DVar2 = DS_STATUS_NULL;
          }
        }
      }
    }
  }
  return DVar2;
}

Assistant:

DS_STATUS ds_list_insert(DsList *list, int index, void *data)
{
    if (NULL == list)
        return DS_STATUS_NULL;
    if (index < 0 || index > list->size)
        return DS_STATUS_OUTMEM;

    DsListEntry *in = (DsListEntry *)malloc(sizeof(DsListEntry));
    if (NULL == in)
        return DS_STATUS_OUTMEM;
    in->data = data;
    in->next = NULL;
    in->prev = NULL;

    DS_STATUS status;

    // ! 这里需要获取list->entry的地址
    DsListEntry **entry = &list->entry;
    while ((*entry) && (*entry)->next && index > 0)
    {
        index--;
        // ! 需要改变的是entry的地址
        entry = &(*entry)->next;
    }

    if (index == list->size)
        status = ds_entry_append(entry, in);
    else
        status = ds_entry_prepend(entry, in);

    if (status != DS_STATUS_OK)
    {
        free(in);
        return DS_STATUS_NULL;
    }

    (list->size)++;
    return DS_STATUS_OK;
}